

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv__udp_is_connected(uv_udp_t *handle)

{
  int iVar1;
  uint uVar2;
  int addrlen;
  sockaddr_storage addr;
  int local_8c;
  sockaddr local_88 [8];
  
  uVar2 = 0;
  if (handle->type == UV_UDP) {
    local_8c = 0x80;
    iVar1 = uv_udp_getpeername(handle,local_88,&local_8c);
    if (iVar1 == 0) {
      uVar2 = (uint)(0 < local_8c);
    }
  }
  return uVar2;
}

Assistant:

int uv__udp_is_connected(uv_udp_t* handle) {
  struct sockaddr_storage addr;
  int addrlen;
  if (handle->type != UV_UDP)
    return 0;

  addrlen = sizeof(addr);
  if (uv_udp_getpeername(handle, (struct sockaddr*) &addr, &addrlen) != 0)
    return 0;

  return addrlen > 0;
}